

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void range_for_suite::sum_array_nulls(void)

{
  bool bVar1;
  size_type sVar2;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_158;
  undefined4 local_150 [2];
  reference local_148;
  basic_variable<std::allocator<char>_> *value;
  iterator __end1;
  iterator __begin1;
  variable *__range1;
  size_type size;
  nullable local_f8 [5];
  nullable local_e4;
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_e0 = &local_d8;
  local_e4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,&local_e4);
  local_e0 = &local_a8;
  local_f8[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,local_f8);
  local_e0 = &local_78;
  size._4_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (local_e0,(nullable *)((long)&size + 4));
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_158 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_158 = local_158 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_158);
  } while (local_158 != &local_d8);
  __range1 = (variable *)0x0;
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &__end1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&value,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  while( true ) {
    bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                      ((iterator *)
                       &__end1.
                        super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                        .current.current,(iterator *)&value);
    if (!bVar1) break;
    local_148 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                          ((iterator *)
                           &__end1.
                            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            .current.current);
    sVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::size(local_148);
    __range1 = (variable *)((long)&(__range1->storage).storage + sVar2);
    trial::dynamic::basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)&__end1.
                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     .current.current);
  }
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&value);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &__end1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_150[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("size","0 + 0 + 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x983,"void range_for_suite::sum_array_nulls()",&__range1,local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void sum_array_nulls()
{
    variable data = array::make({ null, null, null });
    variable::size_type size = 0;
    for (const auto& value : data)
    {
        size += value.size();
    }
    TRIAL_PROTOCOL_TEST_EQUAL(size, 0 + 0 + 0);
}